

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O3

int mk_plugin_sched_remove_client(int socket,mk_server *server)

{
  int iVar1;
  mk_sched_worker *sched;
  mk_sched_conn *conn;
  
  sched = (mk_sched_worker *)pthread_getspecific(mk_tls_sched_worker_node);
  conn = mk_sched_get_connection(sched,socket);
  if (conn != (mk_sched_conn *)0x0) {
    iVar1 = mk_sched_remove_client(conn,sched,server);
    return iVar1;
  }
  return -1;
}

Assistant:

int mk_plugin_sched_remove_client(int socket, struct mk_server *server)
{
    struct mk_sched_conn *conn;
    struct mk_sched_worker *sched;

    MK_TRACE("[FD %i] remove client", socket);

    sched = mk_sched_get_thread_conf();
    conn  = mk_sched_get_connection(sched, socket);
    if (!conn) {
        return -1;
    }

    return mk_sched_remove_client(conn, sched, server);
}